

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

AutoFile * __thiscall
AutoFile::operator>>(AutoFile *this,vector<std::byte,_std::allocator<std::byte>_> *obj)

{
  long lVar1;
  pointer pbVar2;
  uint uVar3;
  uint64_t uVar4;
  size_t in_RCX;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
      super__Vector_impl_data._M_finish != pbVar2) {
    (obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.super__Vector_impl_data
    ._M_finish = pbVar2;
  }
  uVar4 = ReadCompactSize<AutoFile>(this,true);
  uVar7 = (uint)uVar4;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      uVar3 = uVar7 - uVar6;
      if (4999999 < uVar7 - uVar6) {
        uVar3 = 5000000;
      }
      uVar5 = uVar3 + uVar6;
      std::vector<std::byte,_std::allocator<std::byte>_>::resize(obj,(ulong)uVar5);
      read(this,uVar6 + (int)(obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>).
                             _M_impl.super__Vector_impl_data._M_start,(void *)(ulong)uVar3,in_RCX);
      uVar6 = uVar5;
    } while (uVar5 < uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return *this;
    }